

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O0

uint32_t units::stringHash(string *str)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_30;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  uint32_t hash;
  string *str_local;
  
  __range1._4_4_ = 0x25;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_30._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    __range1._4_4_ = __range1._4_4_ * 0xd32b ^ *pcVar2 * 0x12ca3;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

uint32_t stringHash(const std::string& str)
{
    std::uint32_t hash{hashcodes::firstH};
    for (auto c : str) {
        hash = (hash * hashcodes::Ac) ^
            (static_cast<std::uint32_t>(c) * hashcodes::Bc);
    }
    return hash;  // or return h % C;
}